

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int nGain)

{
  int iVar1;
  int iVar2;
  Dec_Node_t *pDVar3;
  Dec_Node_t *pDVar4;
  uint uVar5;
  Ivy_Obj_t *pIVar6;
  uint uVar7;
  long lVar8;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 *paVar9;
  Ivy_Obj_t *pObj;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  if (pGraph->fConst == 0) {
    uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    lVar8 = (long)pGraph->nLeaves;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pDVar3 = pGraph->pNodes;
      if (0x7ffffff < *(uint *)&pDVar3[uVar5].field_0x10) {
        uVar7 = 0;
        do {
          pIVar6 = Ivy_Latch(p,(Ivy_Obj_t *)pDVar3[uVar5].field_2.pFunc,IVY_INIT_DC);
          pDVar3[uVar5].field_2.pFunc = pIVar6;
          uVar7 = uVar7 + 1;
        } while (uVar7 < *(uint *)&pDVar3[uVar5].field_0x10 >> 0x1b);
      }
      paVar9 = &pDVar3[uVar5].field_2;
    }
    else {
      do {
        pDVar4 = pGraph->pNodes;
        pDVar3 = pDVar4 + lVar8;
        pIVar6 = (Ivy_Obj_t *)
                 ((ulong)((uint)pDVar3->eEdge0 & 1) ^
                 (ulong)pDVar4[(uint)pDVar3->eEdge0 >> 1 & 0x3fffffff].field_2.pFunc);
        pObj = (Ivy_Obj_t *)
               ((ulong)((uint)pDVar3->eEdge1 & 1) ^
               (ulong)pDVar4[(uint)pDVar3->eEdge1 >> 1 & 0x3fffffff].field_2.pFunc);
        if ((pDVar3->field_0x12 & 0x3e) != 0) {
          uVar5 = 0;
          do {
            pIVar6 = Ivy_Latch(p,pIVar6,IVY_INIT_DC);
            uVar5 = uVar5 + 1;
          } while (uVar5 < (*(uint *)&pDVar3->field_0x10 >> 0x11 & 0x1f));
        }
        if ((*(ushort *)&pDVar3->field_0x12 & 0x7c0) != 0) {
          uVar5 = 0;
          do {
            pObj = Ivy_Latch(p,pObj,IVY_INIT_DC);
            uVar5 = uVar5 + 1;
          } while (uVar5 < (*(uint *)&pDVar3->field_0x10 >> 0x16 & 0x1f));
        }
        pIVar6 = Ivy_And(p,pIVar6,pObj);
        (pDVar3->field_2).pFunc = pIVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 < pGraph->nSize);
      paVar9 = &pDVar3->field_2;
      if (0x7ffffff < *(uint *)&pDVar3->field_0x10) {
        uVar5 = 0;
        do {
          pIVar6 = Ivy_Latch(p,(Ivy_Obj_t *)(pDVar3->field_2).pFunc,IVY_INIT_DC);
          (pDVar3->field_2).pFunc = pIVar6;
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(uint *)&pDVar3->field_0x10 >> 0x1b);
      }
    }
  }
  else {
    paVar9 = (anon_union_8_2_00c7e208_for_Dec_Node_t__2 *)&p->pConst1;
  }
  Ivy_ObjReplace(p,pRoot,(Ivy_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)paVar9->pFunc),1,0,
                 0);
  if ((iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]) < nGain) {
    __assert_fail("nGain <= nNodesOld - nNodesNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivySeq.c"
                  ,0x218,
                  "void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)");
  }
  Ivy_ManPropagateBuffers(p,0);
  return;
}

Assistant:

void Ivy_GraphUpdateNetworkSeq( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int nGain )
{
    Ivy_Obj_t * pRootNew;
    int nNodesNew, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetworkSeq( p, pGraph );
    Ivy_ObjReplace( p, pRoot, pRootNew, 1, 0, 0 );
    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
    // propagate the buffer
    Ivy_ManPropagateBuffers( p, 0 );
}